

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O3

FT_Error T1_Face_Init(FT_Stream stream,FT_Face t1face,FT_Int face_index,FT_Int num_params,
                     FT_Parameter *params)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  undefined4 uVar5;
  FT_String *pFVar6;
  FT_Memory memory;
  long lVar7;
  FT_Face_Internal pFVar8;
  FT_GlyphSlot_conflict pFVar9;
  bool bVar10;
  FT_Face pFVar11;
  undefined8 uVar12;
  _func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *stream_00;
  undefined7 uVar13;
  undefined7 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 auVar17 [8];
  uint uVar18;
  int iVar19;
  FT_Error FVar20;
  FT_Pointer pvVar21;
  FT_String *pFVar22;
  void *pvVar23;
  FT_Face pFVar24;
  ulong uVar25;
  char *pcVar26;
  long lVar27;
  FT_Fixed FVar28;
  int *piVar29;
  void *pvVar30;
  FT_Pointer pvVar31;
  FT_Stream pFVar32;
  short sVar33;
  FT_Memory size;
  ulong uVar34;
  byte *pbVar35;
  short sVar36;
  FT_Face extraout_RDX;
  FT_Face extraout_RDX_00;
  FT_Face extraout_RDX_01;
  FT_Face extraout_RDX_02;
  FT_Face extraout_RDX_03;
  FT_Face extraout_RDX_04;
  FT_Face extraout_RDX_05;
  FT_Face extraout_RDX_06;
  FT_Face extraout_RDX_07;
  FT_Face extraout_RDX_08;
  FT_Face extraout_RDX_09;
  FT_Face extraout_RDX_10;
  FT_Face extraout_RDX_11;
  FT_Face extraout_RDX_12;
  FT_Face extraout_RDX_13;
  FT_Face extraout_RDX_14;
  FT_Face extraout_RDX_15;
  FT_Byte *extraout_RDX_16;
  FT_Byte *extraout_RDX_17;
  FT_Byte *pFVar37;
  long lVar38;
  FT_Face extraout_RDX_18;
  FT_Face extraout_RDX_19;
  FT_Face extraout_RDX_20;
  FT_Face extraout_RDX_21;
  FT_Face extraout_RDX_22;
  FT_Face extraout_RDX_23;
  FT_Face extraout_RDX_24;
  FT_Face extraout_RDX_25;
  FT_Face extraout_RDX_26;
  FT_Face pFVar39;
  FT_Face extraout_RDX_27;
  FT_Face root;
  char cVar40;
  ushort uVar41;
  FT_Int FVar42;
  char *pcVar43;
  FT_Face pFVar44;
  T1_Loader pTVar45;
  T1_Loader __s2;
  FT_Face pFVar46;
  FT_UInt glyph_index;
  _func_FT_Long_PS_Parser *a;
  undefined8 *puVar47;
  size_t sVar48;
  undefined1 local_c40 [8];
  T1_LoaderRec loader;
  FT_Face local_70;
  FT_Memory local_68;
  FT_Face local_50;
  undefined1 local_48 [8];
  FT_Error error;
  uint local_38;
  undefined1 local_34 [8];
  FT_UShort tag;
  
  t1face->num_faces = 1;
  pvVar21 = ft_module_get_service(&t1face->driver->root,"postscript-cmaps",'\x01');
  t1face[3].num_glyphs = (FT_Long)pvVar21;
  pFVar22 = (FT_String *)FT_Get_Module_Interface((t1face->driver->root).library,"psaux");
  t1face[3].family_name = pFVar22;
  if (pFVar22 == (FT_String *)0x0) {
    return 0xb;
  }
  pvVar23 = FT_Get_Module_Interface((t1face->driver->root).library,"pshinter");
  *(void **)&t1face[3].units_per_EM = pvVar23;
  pFVar6 = t1face[3].family_name;
  memset(local_c40,0,0x2c8);
  t1face[3].bbox.yMin = -1;
  *(undefined4 *)&t1face[3].bbox.xMax = 0;
  t1face[1].memory = (FT_Memory)0x100000007;
  *(undefined4 *)((long)&t1face[1].available_sizes + 4) = 4;
  t1face[2].face_index = 0xf5c;
  t1face[1].driver = (FT_Driver)&DWORD_0027a000;
  memory = t1face->memory;
  pFVar32 = t1face->stream;
  size = memory;
  (*(code *)**(undefined8 **)(pFVar6 + 8))(local_c40,0,0);
  loader.parser.stream = (FT_Stream)0x0;
  loader.parser.base_dict = (FT_Byte *)0x0;
  loader.parser.base_len = 0;
  loader.parser.private_dict._0_7_ = 0;
  loader.parser.private_dict._7_1_ = 0;
  loader.parser.private_len._0_1_ = '\0';
  loader.parser.private_len._1_1_ = '\0';
  loader.parser.private_len._2_1_ = 0;
  pcVar43 = "%!PS-AdobeFont";
  loader.parser.root.funcs.load_field_table =
       (_func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *)pFVar32;
  uVar18 = check_type1_format(pFVar32,"%!PS-AdobeFont",0xe);
  local_48._0_2_ = (undefined2)uVar18;
  local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
  if (uVar18 == 0) {
LAB_0022f83c:
    pcVar43 = (char *)0x0;
    uVar18 = FT_Stream_Seek(pFVar32,0);
    local_48._0_2_ = (undefined2)uVar18;
    local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
    pFVar39 = extraout_RDX_01;
    if (uVar18 != 0) goto LAB_0022f868;
    pcVar43 = local_34;
    uVar18 = read_pfb_tag(pFVar32,(FT_UShort *)pcVar43,(FT_ULong *)&local_50);
    local_48._0_2_ = (undefined2)uVar18;
    local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
    pFVar39 = extraout_RDX_02;
    if (uVar18 != 0) goto LAB_0022f868;
    if (local_34._0_2_ == -0x7fff) {
      loader.parser.private_len._0_1_ = '\x01';
    }
    else {
      pcVar43 = (char *)0x0;
      uVar18 = FT_Stream_Seek(pFVar32,0);
      local_48._0_2_ = (undefined2)uVar18;
      local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
      pFVar39 = extraout_RDX_07;
      if (uVar18 != 0) goto LAB_0022f868;
      local_50 = (FT_Face)pFVar32->size;
    }
    pFVar44 = local_50;
    if (pFVar32->read != (FT_Stream_IoFunc)0x0) {
      pcVar43 = (char *)ft_mem_alloc(memory,(FT_Long)local_50,(FT_Error *)local_48);
      uVar18 = CONCAT22(local_48._2_2_,local_48._0_2_);
      pFVar39 = extraout_RDX_08;
      loader.parser.stream = (FT_Stream)pcVar43;
      if (uVar18 == 0) {
        uVar18 = FT_Stream_Read(pFVar32,(FT_Byte *)pcVar43,(FT_ULong)pFVar44);
        local_48._0_2_ = (undefined2)uVar18;
        local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
        pFVar39 = extraout_RDX_09;
        if (uVar18 == 0) {
          loader.parser.base_dict = (FT_Byte *)pFVar44;
          goto LAB_0022fb09;
        }
      }
      goto LAB_0022f868;
    }
    loader.parser.stream = (FT_Stream)(pFVar32->base + pFVar32->pos);
    loader.parser.base_dict = (FT_Byte *)local_50;
    loader.parser.private_len._1_1_ = '\x01';
    pcVar43 = (char *)local_50;
    uVar18 = FT_Stream_Skip(pFVar32,(FT_Long)local_50);
    local_48._0_2_ = (undefined2)uVar18;
    local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
    pFVar39 = extraout_RDX_10;
    if (uVar18 != 0) goto LAB_0022f868;
LAB_0022fb09:
    local_c40 = (undefined1  [8])loader.parser.stream;
    loader.parser.root.base = loader.parser.base_dict + (long)&(loader.parser.stream)->base;
    loader.parser.root.cursor = (FT_Byte *)local_c40;
LAB_0022f8b4:
    pTVar45 = (T1_Loader)local_c40;
    size = (FT_Memory)loader.parser.base_dict;
    local_38 = parse_dict((T1_Face)t1face,pTVar45,(FT_Byte *)loader.parser.stream,
                          (FT_ULong)loader.parser.base_dict);
    stream_00 = loader.parser.root.funcs.load_field_table;
    uVar12 = loader.parser.root._24_8_;
    FVar42 = (FT_Int)pTVar45;
    pFVar39 = extraout_RDX_04;
    if (local_38 == 0) {
      local_34._0_4_ = 0;
      if ((char)loader.parser.private_len == '\0') {
        pFVar44 = (FT_Face)(loader.parser.base_dict + (long)&(loader.parser.stream)->base);
        pFVar24 = (FT_Face)loader.parser.stream;
        pFVar39 = (FT_Face)loader.parser.base_dict;
        pFVar46 = (FT_Face)loader.parser.stream;
        do {
          pFVar46 = (FT_Face)((long)&pFVar46->face_index + 2);
          while (((((*(char *)((long)&pFVar46[-1].extensions + 6) != 'e' ||
                    (pFVar44 <= (FT_Face)((long)&pFVar46[-1].internal + 7))) ||
                   (*(char *)((long)&pFVar46[-1].extensions + 7) != 'e')) ||
                  ((*(char *)&pFVar46[-1].internal != 'x' ||
                   (*(char *)((long)&pFVar46[-1].internal + 1) != 'e')))) ||
                 (auVar17 = (undefined1  [8])pFVar24, pFVar11 = pFVar46,
                 *(char *)((long)&pFVar46[-1].internal + 2) != 'c'))) {
            pFVar11 = pFVar46 + -1;
            pFVar46 = (FT_Face)((long)&pFVar46->num_faces + 1);
            if (pFVar44 <= (FT_Face)((long)&pFVar11->extensions + 7)) goto LAB_0022fb53;
          }
          while (loader.parser.root.base = (FT_Byte *)pFVar11, local_c40 = auVar17,
                (ulong)local_c40 < pFVar46) {
            if ((((FT_Face)((long)&((FT_Face)local_c40)->num_faces + 5) < pFVar46 &&
                  *(char *)&((FT_Face)local_c40)->num_faces == 'e') &&
                (*(char *)((long)&((FT_Face)local_c40)->num_faces + 1) == 'e')) &&
               ((*(char *)((long)&((FT_Face)local_c40)->num_faces + 2) == 'x' &&
                ((*(char *)((long)&((FT_Face)local_c40)->num_faces + 3) == 'e' &&
                 (*(char *)((long)&((FT_Face)local_c40)->num_faces + 4) == 'c')))))) {
              loader.parser.root.base =
                   loader.parser.base_dict + (long)&(loader.parser.stream)->base;
              (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_c40);
              pFVar37 = loader.parser.root.base;
              sVar48 = (long)loader.parser.root.base - (long)local_c40;
              _error = (FT_Face)local_c40;
              pFVar44 = (FT_Face)0xa;
              pvVar23 = memchr((void *)local_c40,10,sVar48);
              if (pvVar23 == (void *)0x0) {
                bVar10 = true;
                pFVar39 = extraout_RDX_23;
              }
              else {
                pFVar44 = (FT_Face)0xd;
                pvVar30 = memchr(_error,0xd,sVar48);
                bVar10 = pvVar30 < pvVar23;
                pFVar39 = extraout_RDX_24;
              }
              uVar15 = loader.parser.private_dict._7_1_;
              uVar13 = loader.parser.private_dict._0_7_;
              pFVar32 = loader.parser.stream;
              size = (FT_Memory)0x3;
              pFVar24 = _error;
              pFVar46 = _error;
              if (pFVar37 <= _error) goto LAB_0022fb58;
              goto LAB_0023055a;
            }
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_c40);
            pFVar24 = (FT_Face)loader.parser.stream;
            pFVar39 = (FT_Face)loader.parser.base_dict;
            if ((int)loader.parser.root.limit != 0) break;
            (*loader.parser.root.funcs.done)((PS_Parser)local_c40);
            auVar17 = local_c40;
            pFVar24 = (FT_Face)loader.parser.stream;
            pFVar39 = (FT_Face)loader.parser.base_dict;
            pFVar11 = (FT_Face)loader.parser.root.base;
          }
          pFVar44 = (FT_Face)((long)&pFVar39->num_faces + (long)&pFVar24->num_faces);
          size = (FT_Memory)0x3;
        } while (pFVar46 < pFVar44);
      }
      else {
        _error = (FT_Face)FT_Stream_Pos((FT_Stream)loader.parser.root.funcs.load_field_table);
        loader.parser.private_dict._0_7_ = 0;
        loader.parser.private_dict._7_1_ = 0;
        do {
          pFVar44 = (FT_Face)local_48;
          uVar18 = read_pfb_tag((FT_Stream)stream_00,(FT_UShort *)local_48,(FT_ULong *)&local_50);
          pFVar39 = extraout_RDX_05;
          if (uVar18 != 0) break;
          if (local_48._0_2_ != 0x8002) {
            if (CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_) == 0)
            goto LAB_0022fb53;
            pFVar44 = _error;
            uVar18 = FT_Stream_Seek((FT_Stream)stream_00,(FT_ULong)_error);
            pFVar39 = extraout_RDX_11;
            local_34._0_4_ = uVar18;
            if (uVar18 == 0) {
              pFVar44 = (FT_Face)CONCAT17(loader.parser.private_dict._7_1_,
                                          loader.parser.private_dict._0_7_);
              loader.parser.base_len =
                   (FT_ULong)ft_mem_alloc((FT_Memory)uVar12,(FT_Long)pFVar44,(FT_Error *)local_34);
              size = (FT_Memory)(ulong)(uint)local_34._0_4_;
              pFVar39 = extraout_RDX_18;
              if (local_34._0_4_ != 0) goto LAB_0022fb58;
              loader.parser.private_dict._0_7_ = 0;
              loader.parser.private_dict._7_1_ = 0;
              FVar20 = read_pfb_tag((FT_Stream)stream_00,(FT_UShort *)local_48,(FT_ULong *)&local_50
                                   );
              if ((FVar20 != 0) || (local_48._0_2_ != 0x8002)) goto LAB_00230123;
              goto LAB_002300d4;
            }
            break;
          }
          lVar7 = (long)&local_50->num_faces +
                  CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
          loader.parser.private_dict._0_7_ = (undefined7)lVar7;
          loader.parser.private_dict._7_1_ = (undefined1)((ulong)lVar7 >> 0x38);
          pFVar44 = local_50;
          uVar18 = FT_Stream_Skip((FT_Stream)stream_00,(FT_Long)local_50);
          pFVar39 = extraout_RDX_06;
          local_34._0_4_ = uVar18;
        } while (uVar18 == 0);
LAB_0022fb4f:
        size = (FT_Memory)(ulong)uVar18;
      }
      goto LAB_0022fb58;
    }
  }
  else {
    pFVar39 = extraout_RDX;
    if ((char)uVar18 == '\x02') {
      pcVar43 = "%!FontType";
      uVar18 = check_type1_format(pFVar32,"%!FontType",10);
      local_48._0_2_ = (undefined2)uVar18;
      local_48._2_2_ = (undefined2)(uVar18 >> 0x10);
      pFVar39 = extraout_RDX_00;
      if (uVar18 == 0) goto LAB_0022f83c;
    }
LAB_0022f868:
    FVar42 = (FT_Int)pcVar43;
    local_38 = uVar18;
    if (loader.parser.private_len._1_1_ == '\0') {
      ft_mem_free(memory,loader.parser.stream);
      FVar42 = (FT_Int)loader.parser.stream;
      loader.parser.stream = (FT_Stream)0x0;
      pFVar39 = extraout_RDX_03;
      local_38 = CONCAT22(local_48._2_2_,local_48._0_2_);
      if (CONCAT22(local_48._2_2_,local_48._0_2_) == 0) {
        local_38 = 0;
        goto LAB_0022f8b4;
      }
    }
  }
  goto LAB_0022fb5b;
  while( true ) {
    pFVar46 = (FT_Face)((long)&pFVar46->num_faces + 1);
    pFVar39 = (FT_Face)((long)&pFVar24->num_faces + 1);
    pFVar24 = pFVar39;
    if (pFVar46 == (FT_Face)pFVar37) break;
LAB_0023055a:
    bVar3 = *(byte *)&pFVar46->num_faces;
    pFVar44 = (FT_Face)(ulong)bVar3;
    if ((((bVar3 != 9) && (bVar3 != 0x20)) && (bVar3 != 10)) && (!(bool)(bVar3 == 0xd & bVar10))) {
      sVar48 = (long)(loader.parser.base_dict + (long)loader.parser.stream) - (long)pFVar24;
      loader.parser.private_dict._7_1_ = (undefined1)(sVar48 >> 0x38);
      uVar16 = loader.parser.private_dict._7_1_;
      loader.parser.private_dict._0_7_ = (undefined7)sVar48;
      uVar14 = loader.parser.private_dict._0_7_;
      _error = pFVar46;
      if (loader.parser.private_len._1_1_ == '\0') {
        loader.parser.private_len._2_1_ = 1;
        loader.parser.stream = (FT_Stream)0x0;
        loader.parser.base_dict = (FT_Byte *)0x0;
      }
      else {
        pFVar44 = (FT_Face)(sVar48 + 1);
        loader.parser.private_dict._0_7_ = uVar13;
        loader.parser.private_dict._7_1_ = uVar15;
        pFVar32 = (FT_Stream)ft_mem_alloc((FT_Memory)uVar12,(FT_Long)pFVar44,(FT_Error *)local_34);
        size = (FT_Memory)(ulong)(uint)local_34._0_4_;
        pFVar39 = extraout_RDX_27;
        loader.parser.base_len = (FT_ULong)pFVar32;
        if (local_34._0_4_ != 0) break;
      }
      pbVar35 = (byte *)((long)&_error->num_faces + 3);
      loader.parser.base_len = (FT_ULong)pFVar32;
      loader.parser.private_dict._0_7_ = uVar14;
      loader.parser.private_dict._7_1_ = uVar16;
      if ((((pbVar35 < pFVar37) &&
           ((*(byte *)&_error->num_faces - 0x30 < 10 ||
            ((uVar18 = *(byte *)&_error->num_faces - 0x41, uVar18 < 0x26 &&
             ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))))) &&
          ((bVar3 = *(byte *)((long)&_error->num_faces + 1), bVar3 - 0x30 < 10 ||
           ((uVar18 = bVar3 - 0x41, uVar18 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))))) &&
         (((bVar3 = *(byte *)((long)&_error->num_faces + 2), bVar3 - 0x30 < 10 ||
           ((uVar18 = bVar3 - 0x41, uVar18 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))) &&
          ((bVar3 = *pbVar35, bVar3 - 0x30 < 10 ||
           ((uVar18 = bVar3 - 0x41, uVar18 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))))))) {
        local_c40 = (undefined1  [8])_error;
        (**(code **)(*(long *)(pFVar6 + 8) + 0x30))(local_c40,pFVar32,sVar48,local_48);
        lVar7 = CONCAT44(local_48._4_4_,CONCAT22(local_48._2_2_,local_48._0_2_));
        loader.parser.private_dict._0_7_ = (undefined7)lVar7;
        loader.parser.private_dict._7_1_ = SUB41(local_48._4_4_,3);
        *(undefined1 *)(loader.parser.base_len + lVar7) = 0;
      }
      else {
        memmove(pFVar32,_error,sVar48);
      }
      goto LAB_0023012a;
    }
  }
  goto LAB_0022fb58;
LAB_0022fb53:
  size = (FT_Memory)0x3;
  goto LAB_0022fb58;
  while( true ) {
    lVar7 = (long)&pFVar24->num_faces +
            CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
    loader.parser.private_dict._0_7_ = (undefined7)lVar7;
    loader.parser.private_dict._7_1_ = (undefined1)((ulong)lVar7 >> 0x38);
    FVar20 = read_pfb_tag((FT_Stream)stream_00,(FT_UShort *)local_48,(FT_ULong *)&local_50);
    if ((FVar20 != 0) || (local_48._0_2_ != 0x8002)) break;
LAB_002300d4:
    pFVar24 = local_50;
    local_34._0_4_ = 0;
    pFVar44 = (FT_Face)(loader.parser.base_len +
                       CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_));
    uVar18 = FT_Stream_Read((FT_Stream)stream_00,(FT_Byte *)pFVar44,(FT_ULong)local_50);
    pFVar39 = extraout_RDX_19;
    local_34._0_4_ = uVar18;
    if (uVar18 != 0) goto LAB_0022fb4f;
  }
LAB_00230123:
  local_34._0_4_ = 0;
LAB_0023012a:
  pFVar44 = (FT_Face)CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
  (**(code **)(pFVar6 + 0x20))(loader.parser.base_len,pFVar44,0xd971);
  FVar42 = (FT_Int)pFVar44;
  size = (FT_Memory)0x3;
  pFVar39 = extraout_RDX_20;
  if (3 < CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_)) {
    *(undefined1 *)loader.parser.base_len = 0x20;
    *(undefined1 *)(loader.parser.base_len + 1) = 0x20;
    *(undefined1 *)(loader.parser.base_len + 2) = 0x20;
    *(undefined1 *)(loader.parser.base_len + 3) = 0x20;
    local_c40 = (undefined1  [8])loader.parser.base_len;
    size = (FT_Memory)CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
    loader.parser.root.cursor = (FT_Byte *)loader.parser.base_len;
    loader.parser.root.base = (FT_Byte *)((long)&size->user + loader.parser.base_len);
    local_38 = local_34._0_4_;
    pFVar39 = (FT_Face)loader.parser.base_len;
    if (local_34._0_4_ == 0) {
      pTVar45 = (T1_Loader)local_c40;
      local_38 = parse_dict((T1_Face)t1face,pTVar45,(FT_Byte *)loader.parser.base_len,(FT_ULong)size
                           );
      FVar42 = (FT_Int)pTVar45;
      pFVar39 = extraout_RDX_21;
      if (local_38 == 0) {
        *(byte *)&t1face[1].num_charmaps = (byte)t1face[1].num_charmaps & 0xfe;
        piVar29 = (int *)t1face[3].bbox.xMin;
        if (piVar29 == (int *)0x0) {
LAB_00230304:
          *(undefined4 *)&t1face[3].bbox.xMax = 0;
        }
        else {
          if ((piVar29[0xbe] != 0) && (piVar29[0xbe] != piVar29[1])) {
            piVar29[0xbe] = 0;
          }
          if ((*piVar29 == 0) || (uVar18 = piVar29[1], uVar18 == 0)) {
            T1_Done_Blend((T1_Face)t1face);
            piVar29 = (int *)t1face[3].bbox.xMin;
            pFVar39 = extraout_RDX_22;
            if (piVar29 == (int *)0x0) goto LAB_00230304;
            uVar18 = piVar29[1];
            if (uVar18 != 0) goto LAB_0023022e;
          }
          else {
LAB_0023022e:
            piVar29 = piVar29 + 0x2a;
            uVar34 = (ulong)uVar18;
            do {
              if ((char)*piVar29 == '\0') {
                T1_Done_Blend((T1_Face)t1face);
                pFVar39 = extraout_RDX_25;
                if (t1face[3].bbox.xMin == 0) goto LAB_00230304;
                break;
              }
              piVar29 = piVar29 + 6;
              uVar34 = uVar34 - 1;
            } while (uVar34 != 0);
          }
          size = (FT_Memory)(ulong)(uint)t1face[3].bbox.xMax;
          if (size != (FT_Memory)0x0) {
            pTVar45 = (T1_Loader)0x8;
            pvVar31 = ft_mem_realloc(t1face->memory,8,0,(FT_Long)size,(void *)0x0,
                                     (FT_Error *)&local_38);
            FVar42 = (FT_Int)pTVar45;
            t1face[3].bbox.yMax = (FT_Pos)pvVar31;
            pFVar39 = extraout_RDX_26;
            if (local_38 != 0) {
              *(undefined4 *)&t1face[3].bbox.xMax = 0;
              goto LAB_0022fb5b;
            }
          }
        }
        FVar42 = (FT_Int)pTVar45;
        t1face[2].max_advance_width = loader.encoding_table.funcs.release._0_2_;
        t1face[2].max_advance_height = loader.encoding_table.funcs.release._2_2_;
        if (loader.subrs.capacity != 0) {
          *(undefined4 *)&t1face[2].bbox.yMin = loader.swap_table.funcs.release._0_4_;
          t1face[2].generic.data = (void *)loader._592_8_;
          t1face[2].bbox.xMax = loader.subrs._32_8_;
          t1face[2].bbox.yMax = (FT_Pos)loader.subrs.elements;
          *(_func_void_PS_Table **)&t1face[2].units_per_EM = loader.subrs.funcs.release;
          loader.subrs.capacity = 0;
          loader.subrs.funcs.release = (_func_void_PS_Table *)0x0;
        }
        if ((t1face->internal->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) &&
           (loader.charstrings.capacity == 0)) {
          local_38 = 3;
        }
        size = (FT_Memory)0x0;
        loader.charstrings.capacity = 0;
        t1face[2].generic.finalizer = (FT_Generic_Finalizer)loader.glyph_names.funcs.release;
        t1face[2].size = (FT_Size)loader.charstrings._32_8_;
        t1face[2].charmap = (FT_CharMap)loader.charstrings.elements;
        t1face[2].bbox.xMin = loader._296_8_;
        t1face[2].glyph = (FT_GlyphSlot_conflict)loader.glyph_names._32_8_;
        loader.num_glyphs = 0;
        loader._300_4_ = 0;
        local_70._0_4_ = 0;
        loader.glyph_names.max_elems = 0;
        loader.glyph_names.num_elems = 0;
        if (*(int *)&t1face[2].style_name == 1) {
          pFVar39 = (FT_Face)(long)(int)loader.encoding_table.init;
          local_68._0_4_ = 0;
          if (0 < (long)pFVar39) {
            pFVar44 = (FT_Face)0x0;
            local_68 = (FT_Memory)0x0;
            local_70 = (FT_Face)0x0;
            do {
              *(undefined2 *)(*(long *)&t1face[2].num_charmaps + (long)pFVar44 * 2) = 0;
              t1face[2].charmaps[(long)pFVar44] = (FT_CharMap)".notdef";
              pcVar43 = *(char **)(loader.encoding_table._32_8_ + (long)pFVar44 * 8);
              size = (FT_Memory)
                     CONCAT71(loader.encoding_table._33_7_,
                              pcVar43 == (char *)0x0 ||
                              (int)(uint)loader.encoding_table.funcs.release < 1);
              if (pcVar43 != (char *)0x0 && (int)(uint)loader.encoding_table.funcs.release >= 1) {
                pFVar9 = t1face[2].glyph;
                uVar34 = 0;
                _error = pFVar44;
                do {
                  __s2 = (T1_Loader)(&pFVar9->library)[uVar34];
                  pTVar45 = __s2;
                  iVar19 = strcmp(pcVar43,(char *)__s2);
                  pFVar44 = _error;
                  if (iVar19 == 0) {
                    *(short *)(*(long *)&t1face[2].num_charmaps + (long)_error * 2) = (short)uVar34;
                    t1face[2].charmaps[(long)_error] = (FT_CharMap)__s2;
                    iVar19 = strcmp(".notdef",(char *)__s2);
                    pTVar45 = __s2;
                    if (iVar19 != 0) {
                      if ((int)pFVar44 < (int)local_70) {
                        local_70 = pFVar44;
                      }
                      local_70 = (FT_Face)((ulong)local_70 & 0xffffffff);
                      size = local_68;
                      if ((long)(int)local_68 <= (long)pFVar44) {
                        size = (FT_Memory)(ulong)((int)pFVar44 + 1);
                        local_68 = size;
                      }
                    }
                    break;
                  }
                  uVar34 = uVar34 + 1;
                } while ((uint)loader.encoding_table.funcs.release != uVar34);
              }
              FVar42 = (FT_Int)pTVar45;
              pFVar44 = (FT_Face)((long)&pFVar44->num_faces + 1);
            } while (pFVar44 != pFVar39);
          }
          *(undefined4 *)&t1face[2].field_0x3c = local_70._0_4_;
          *(undefined4 *)&t1face[2].available_sizes = local_68._0_4_;
          t1face[2].num_fixed_sizes = loader.parser._184_4_;
        }
      }
    }
    goto LAB_0022fb5b;
  }
LAB_0022fb58:
  FVar42 = (FT_Int)pFVar44;
  local_38 = (uint)size;
LAB_0022fb5b:
  uVar12 = loader.parser.root._24_8_;
  if (loader.encoding_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.encoding_table.funcs.add)((PS_Table)&loader.num_chars,FVar42,pFVar39,(FT_UInt)size);
    pFVar39 = extraout_RDX_12;
  }
  if (loader.charstrings.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.charstrings.funcs.add)
              ((PS_Table)&loader.glyph_names.funcs.release,FVar42,pFVar39,(FT_UInt)size);
    pFVar39 = extraout_RDX_13;
  }
  if (loader.glyph_names.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.glyph_names.funcs.add)((PS_Table)&loader.num_glyphs,FVar42,pFVar39,(FT_UInt)size);
    pFVar39 = extraout_RDX_14;
  }
  if (loader.swap_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.swap_table.funcs.add)
              ((PS_Table)&loader.charstrings.funcs.release,FVar42,pFVar39,(FT_UInt)size);
    pFVar39 = extraout_RDX_15;
  }
  if (loader.subrs.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.subrs.funcs.add)((PS_Table)&loader.num_subrs,FVar42,pFVar39,(FT_UInt)size);
  }
  ft_hash_str_free((FT_Hash)loader.subrs.funcs.release,(FT_Memory)uVar12);
  ft_mem_free((FT_Memory)uVar12,loader.subrs.funcs.release);
  loader.subrs.funcs.release = (_func_void_PS_Table *)0x0;
  pFVar32 = (FT_Stream)loader.parser.base_len;
  ft_mem_free((FT_Memory)loader.parser.root._24_8_,(void *)loader.parser.base_len);
  loader.parser.base_len = 0;
  pFVar37 = extraout_RDX_16;
  if (loader.parser.private_len._1_1_ == '\0') {
    pFVar32 = loader.parser.stream;
    ft_mem_free((FT_Memory)loader.parser.root._24_8_,loader.parser.stream);
    loader.parser.stream = (FT_Stream)0x0;
    pFVar37 = extraout_RDX_17;
  }
  (*loader.parser.root.funcs.init)((PS_Parser)local_c40,(FT_Byte *)pFVar32,pFVar37,size);
  if (face_index < 0 || local_38 != 0) {
    return local_38;
  }
  if ((short)face_index != 0) {
    return 6;
  }
  iVar19._0_2_ = t1face[2].max_advance_width;
  iVar19._2_2_ = t1face[2].max_advance_height;
  t1face->num_glyphs = (long)iVar19;
  t1face->face_index = 0;
  uVar34 = t1face->face_flags;
  uVar25 = uVar34 | 0xa11;
  t1face->face_flags = uVar25;
  if (*(char *)&t1face[1].style_name != '\0') {
    uVar25 = uVar34 | 0xa15;
    t1face->face_flags = uVar25;
  }
  lVar7 = t1face[3].bbox.xMin;
  if (lVar7 != 0) {
    t1face->face_flags = uVar25 | 0x100;
  }
  pcVar43 = (char *)t1face[1].style_flags;
  t1face->family_name = pcVar43;
  t1face->style_name = (FT_String *)0x0;
  if (pcVar43 == (char *)0x0) {
    if (t1face[2].family_name != (FT_String *)0x0) {
      t1face->family_name = t1face[2].family_name;
    }
LAB_0022fd2e:
    pcVar26 = "Regular";
    if ((char *)t1face[1].num_glyphs != (char *)0x0) {
      pcVar26 = (char *)t1face[1].num_glyphs;
    }
  }
  else {
    pcVar26 = (char *)t1face[1].face_flags;
    if (pcVar26 == (char *)0x0) goto LAB_0022fd2e;
    cVar40 = *pcVar26;
    while (cVar40 != '\0') {
      cVar2 = *pcVar43;
      if (cVar40 == cVar2) {
        pcVar43 = pcVar43 + 1;
LAB_0022fd03:
        pcVar26 = pcVar26 + 1;
      }
      else {
        if ((cVar40 == '-') || (cVar40 == ' ')) goto LAB_0022fd03;
        if ((cVar2 != ' ') && (cVar2 != '-')) {
          if (cVar2 != '\0') goto LAB_0022fd2e;
          goto LAB_0022fd48;
        }
        pcVar43 = pcVar43 + 1;
      }
      cVar40 = *pcVar26;
    }
    pcVar26 = "Regular";
  }
LAB_0022fd48:
  t1face->style_name = pcVar26;
  uVar34 = (ulong)(t1face[1].family_name != (FT_String *)0x0);
  t1face->style_flags = uVar34;
  pcVar43 = (char *)t1face[1].num_glyphs;
  if ((pcVar43 != (char *)0x0) &&
     ((iVar19 = strcmp(pcVar43,"Bold"), iVar19 == 0 ||
      (iVar19 = strcmp(pcVar43,"Black"), iVar19 == 0)))) {
    t1face->style_flags = uVar34 | 2;
  }
  t1face->num_fixed_sizes = 0;
  t1face->available_sizes = (FT_Bitmap_Size *)0x0;
  (t1face->bbox).xMin = (long)t1face[2].extensions >> 0x10;
  pFVar8 = t1face[2].internal;
  (t1face->bbox).yMin = (long)pFVar8 >> 0x10;
  lVar27 = t1face[3].num_faces + 0xffff;
  (t1face->bbox).xMax = lVar27 >> 0x10;
  lVar38 = t1face[3].face_index + 0xffff;
  (t1face->bbox).yMax = lVar38 >> 0x10;
  uVar41 = t1face->units_per_EM;
  if (uVar41 == 0) {
    t1face->units_per_EM = 1000;
    uVar41 = 1000;
  }
  sVar36 = (short)((ulong)lVar38 >> 0x10);
  t1face->ascender = sVar36;
  sVar33 = (short)((ulong)pFVar8 >> 0x10);
  t1face->descender = sVar33;
  uVar18 = (int)sVar36 - (int)sVar33;
  if ((int)uVar18 <= (int)(short)((ulong)((uint)uVar41 * 0xc) * 0x1999999a >> 0x20)) {
    uVar18 = ((uint)uVar41 * 0xc) / 10;
  }
  t1face->height = (FT_Short)uVar18;
  t1face->max_advance_width = (FT_Short)((ulong)lVar27 >> 0x10);
  pFVar6 = t1face[3].family_name;
  iVar19 = (*(code *)**(undefined8 **)(pFVar6 + 0x18))
                     (local_c40,t1face,0,0,t1face[2].glyph,lVar7,0,0,T1_Parse_Glyph);
  if (iVar19 == 0) {
    loader.parser.root.funcs.to_token_array._6_1_ = 1;
    loader.parser.root.funcs.to_token_array._4_1_ = 0;
    glyph_index = 0;
    iVar4._0_2_ = t1face[2].max_advance_width;
    iVar4._2_2_ = t1face[2].max_advance_height;
    if (iVar4 < 1) {
      a = (_func_FT_Long_PS_Parser *)0x0;
    }
    else {
      a = (_func_FT_Long_PS_Parser *)0x0;
      do {
        T1_Parse_Glyph((T1_Decoder_conflict)local_c40,glyph_index);
        if ((long)a < (long)loader.parser.root.funcs.to_int) {
          a = loader.parser.root.funcs.to_int;
        }
        if (glyph_index == 0) {
          a = loader.parser.root.funcs.to_int;
        }
        glyph_index = glyph_index + 1;
        iVar1._0_2_ = t1face[2].max_advance_width;
        iVar1._2_2_ = t1face[2].max_advance_height;
      } while ((int)glyph_index < iVar1);
    }
    (**(code **)(*(long *)(pFVar6 + 0x18) + 8))(local_c40);
    FVar28 = FT_RoundFix((FT_Fixed)a);
    t1face->max_advance_width = (FT_Short)((ulong)FVar28 >> 0x10);
  }
  t1face->max_advance_height = t1face->height;
  uVar5 = *(undefined4 *)((long)&t1face[1].style_name + 2);
  t1face->underline_position = (short)uVar5;
  t1face->underline_thickness = (short)((uint)uVar5 >> 0x10);
  if (pvVar21 == (FT_Pointer)0x0) {
switchD_0022ffd6_default:
    FVar20 = 0;
  }
  else {
    puVar47 = *(undefined8 **)(pFVar22 + 0x40);
    loader.parser.root.cursor = (FT_Byte *)0x10003756e6963;
    local_c40 = (undefined1  [8])t1face;
    FVar20 = FT_CMap_New((FT_CMap_Class)puVar47[3],(FT_Pointer)0x0,(FT_CharMap)local_c40,
                         (FT_CMap_conflict *)0x0);
    if (FVar20 != 0 && (char)FVar20 != -0x5d) {
      return FVar20;
    }
    switch(*(undefined4 *)&t1face[2].style_name) {
    case 1:
      loader.parser.root.cursor = (FT_Byte *)0x2000741444243;
      puVar47 = puVar47 + 2;
      break;
    case 2:
      loader.parser.root.cursor = (FT_Byte *)0x741444f42;
      break;
    case 3:
      puVar47 = puVar47 + 3;
      loader.parser.root.cursor = (FT_Byte *)0x300076c617431;
      break;
    case 4:
      loader.parser.root.cursor = (FT_Byte *)0x1000741444245;
      puVar47 = puVar47 + 1;
      break;
    default:
      goto switchD_0022ffd6_default;
    }
    FVar20 = 0;
    if ((FT_CMap_Class)*puVar47 != (FT_CMap_Class)0x0) {
      FVar20 = FT_CMap_New((FT_CMap_Class)*puVar47,(FT_Pointer)0x0,(FT_CharMap)local_c40,
                           (FT_CMap_conflict *)0x0);
    }
  }
  return FVar20;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Face_Init( FT_Stream      stream,
                FT_Face        t1face,          /* T1_Face */
                FT_Int         face_index,
                FT_Int         num_params,
                FT_Parameter*  params )
  {
    T1_Face             face = (T1_Face)t1face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T1_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    face->pshinter = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                              "pshinter" );

    FT_TRACE2(( "Type 1 driver\n" ));

    /* open the tokenizer; this will also check the font format */
    error = T1_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T1_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      FT_Face  root = (FT_Face)&face->root;


      root->num_glyphs = type1->num_glyphs;
      root->face_index = 0;

      root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_GLYPH_NAMES |
                          FT_FACE_FLAG_HINTER;

      if ( info->is_fixed_pitch )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( face->blend )
        root->face_flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;

      /* The following code to extract the family and the style is very   */
      /* simplistic and might get some things wrong.  For a full-featured */
      /* algorithm you might have a look at the whitepaper given at       */
      /*                                                                  */
      /*   https://blogs.msdn.com/text/archive/2007/04/23/wpf-font-selection-model.aspx */

      /* get style name -- be careful, some broken fonts only */
      /* have a `/FontName' dictionary entry!                 */
      root->family_name = info->family_name;
      root->style_name  = NULL;

      if ( root->family_name )
      {
        char*  full   = info->full_name;
        char*  family = root->family_name;


        if ( full )
        {
          FT_Bool  the_same = TRUE;


          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                the_same = FALSE;

                if ( !*family )
                  root->style_name = full;
                break;
              }
            }
          }

          if ( the_same )
            root->style_name = (char *)"Regular";
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( type1->font_name )
          root->family_name = type1->font_name;
      }

      if ( !root->style_name )
      {
        if ( info->weight )
          root->style_name = info->weight;
        else
          /* assume `Regular' style because we don't know better */
          root->style_name = (char *)"Regular";
      }

      /* compute style flags */
      root->style_flags = 0;
      if ( info->italic_angle )
        root->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          root->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      root->num_fixed_sizes = 0;
      root->available_sizes = NULL;

      root->bbox.xMin =   type1->font_bbox.xMin            >> 16;
      root->bbox.yMin =   type1->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      root->bbox.xMax = ( type1->font_bbox.xMax + 0xFFFF ) >> 16;
      root->bbox.yMax = ( type1->font_bbox.yMax + 0xFFFF ) >> 16;

      /* Set units_per_EM if we didn't set it in t1_parse_font_matrix. */
      if ( !root->units_per_EM )
        root->units_per_EM = 1000;

      root->ascender  = (FT_Short)( root->bbox.yMax );
      root->descender = (FT_Short)( root->bbox.yMin );

      root->height = (FT_Short)( ( root->units_per_EM * 12 ) / 10 );
      if ( root->height < root->ascender - root->descender )
        root->height = (FT_Short)( root->ascender - root->descender );

      /* now compute the maximum advance width */
      root->max_advance_width =
        (FT_Short)( root->bbox.xMax );
      {
        FT_Pos  max_advance;


        error = T1_Compute_Max_Advance( face, &max_advance );

        /* in case of error, keep the standard width */
        if ( !error )
          root->max_advance_width = (FT_Short)FIXED_TO_INT( max_advance );
        else
          error = FT_Err_Ok;   /* clear error */
      }

      root->max_advance_height = root->height;

      root->underline_position  = (FT_Short)info->underline_position;
      root->underline_thickness = (FT_Short)info->underline_thickness;
    }

    {
      FT_Face  root = &face->root;


      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }

  Exit:
    return error;
  }